

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

GLint __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeTexParameterCase::getParamValue
          (NegativeTexParameterCase *this)

{
  NegativeTexParameterCase *this_local;
  
  switch(this->m_texParam) {
  case TEXTURE_MIN_FILTER:
    this_local._4_4_ = 0x2601;
    break;
  case TEXTURE_MAG_FILTER:
    this_local._4_4_ = 0x2601;
    break;
  case TEXTURE_WRAP_S:
    this_local._4_4_ = 0x812f;
    break;
  case TEXTURE_WRAP_T:
    this_local._4_4_ = 0x812f;
    break;
  case TEXTURE_WRAP_R:
    this_local._4_4_ = 0x812f;
    break;
  case TEXTURE_MIN_LOD:
    this_local._4_4_ = 1;
    break;
  case TEXTURE_MAX_LOD:
    this_local._4_4_ = 5;
    break;
  case TEXTURE_COMPARE_MODE:
    this_local._4_4_ = 0;
    break;
  case TEXTURE_COMPARE_FUNC:
    this_local._4_4_ = 0x205;
    break;
  case TEXTURE_BASE_LEVEL:
    this_local._4_4_ = 2;
    break;
  default:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

glw::GLint NegativeTexParameterCase::getParamValue (void) const
{
	switch (m_texParam)
	{
		case TEXTURE_MIN_FILTER:	return GL_LINEAR;
		case TEXTURE_MAG_FILTER:	return GL_LINEAR;
		case TEXTURE_WRAP_S:		return GL_CLAMP_TO_EDGE;
		case TEXTURE_WRAP_T:		return GL_CLAMP_TO_EDGE;
		case TEXTURE_WRAP_R:		return GL_CLAMP_TO_EDGE;
		case TEXTURE_MIN_LOD:		return 1;
		case TEXTURE_MAX_LOD:		return 5;
		case TEXTURE_COMPARE_MODE:	return GL_NONE;
		case TEXTURE_COMPARE_FUNC:	return GL_NOTEQUAL;
		case TEXTURE_BASE_LEVEL:	return 2;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}